

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O2

void __thiscall Refal2::CArbitraryInteger::GetTextValue(CArbitraryInteger *this,string *text)

{
  bool bVar1;
  ostream *poVar2;
  CArbitraryInteger decimal;
  CArbitraryInteger tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream stringStream;
  undefined8 auStack_198 [45];
  
  removeLeadingZeros(this);
  bVar1 = IsZero(this);
  if (bVar1) {
    std::__cxx11::string::assign((char *)text);
    return;
  }
  text->_M_string_length = 0;
  *(text->_M_dataplus)._M_p = '\0';
  tmp.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  tmp._17_8_ = 0;
  tmp.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tmp.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  tmp.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  Copy(this,&tmp);
  while( true ) {
    bVar1 = IsZero(&tmp);
    if (bVar1) {
      std::__cxx11::string::find_first_not_of((char)text,0x30);
      std::__cxx11::string::erase((ulong)text,0);
      if (this->isNegative == true) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stringStream,"-",text);
        std::__cxx11::string::operator=((string *)text,(string *)&stringStream);
        std::__cxx11::string::~string((string *)&stringStream);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&tmp);
      return;
    }
    CArbitraryInteger(&decimal,10000000);
    Div(&tmp,&decimal);
    if ((long)decimal.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)decimal.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != 4) break;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stringStream);
    *(undefined8 *)((long)auStack_198 + *(long *)(_stringStream + -0x18)) = 7;
    poVar2 = std::operator<<((ostringstream *)&stringStream,0x30);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__cxx11::stringbuf::str();
    std::operator+(&local_1c8,&local_1e8,text);
    std::__cxx11::string::operator=((string *)text,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stringStream);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&decimal);
  }
  __assert_fail("decimal.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                ,0x73,"void Refal2::CArbitraryInteger::GetTextValue(std::string &) const");
}

Assistant:

void CArbitraryInteger::GetTextValue( std::string& text ) const
{
	const_cast<CArbitraryInteger&>( *this ).removeLeadingZeros();
	if( IsZero() ) {
		text = "0";
		return;
	}
	text.clear();
	CArbitraryInteger tmp;
	Copy( tmp );
	while( !tmp.IsZero() ) {
		CArbitraryInteger decimal( 10000000 );
		tmp.Div( decimal );
		assert( decimal.size() == 1 );
		std::ostringstream stringStream;
		stringStream << std::setw( 7 ) << std::setfill( '0' ) << decimal[0];
		text = stringStream.str() + text;
	}
	text.erase( 0, text.find_first_not_of( '0' ) );
	if( IsNegative() ) {
		text = "-" + text;
	}
}